

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

void http_on_open_client(intptr_t uuid,void *set_)

{
  undefined8 *puVar1;
  fio_protocol_s *pfVar2;
  void *pvVar3;
  
  puVar1 = *(undefined8 **)((long)set_ + 0x20);
  fio_timeout_set(uuid,*(uint8_t *)((long)set_ + 0x78));
  pfVar2 = http1_new(uuid,(http_settings_s *)set_,(void *)0x0,0);
  if (pfVar2 != (fio_protocol_s *)0x0) {
    *(_func_void_intptr_t_fio_protocol_s_ptr **)((long)set_ + 0x80) = pfVar2->on_close;
    pfVar2->on_close = http_on_close_client;
    puVar1[1] = pfVar2;
    pvVar3 = http1_vtable();
    *puVar1 = pvVar3;
    (**(code **)((long)set_ + 0x10))(*(undefined8 *)((long)set_ + 0x20));
    return;
  }
  fio_close(uuid);
  return;
}

Assistant:

static void http_on_open_client(intptr_t uuid, void *set_) {
  http_on_open_client_http1(uuid, set_, NULL);
}